

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::ParmParse::dumpTable(ostream *os,bool prettyPrint)

{
  bool bVar1;
  pointer pPVar2;
  ostream *poVar3;
  byte in_SIL;
  ostream *in_RDI;
  const_list_iterator End;
  const_list_iterator li;
  PP_entry *in_stack_00000138;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
  *in_stack_ffffffffffffff78;
  PP_entry *in_stack_ffffffffffffff90;
  ostream *in_stack_ffffffffffffff98;
  PP_entry local_50;
  ostream *local_8;
  
  local_50._71_1_ = in_SIL & 1;
  local_8 = in_RDI;
  local_50.m_vals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::__cxx11::
                list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::begin
                          (in_stack_ffffffffffffff78);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator
            ((_List_const_iterator<amrex::ParmParse::PP_entry> *)&local_50.m_table,
             (iterator *)
             &local_50.m_vals.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_50.m_vals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::
                list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::end
                          (in_stack_ffffffffffffff78);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator
            ((_List_const_iterator<amrex::ParmParse::PP_entry> *)
             &local_50.m_vals.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(iterator *)&local_50.m_vals);
  do {
    bVar1 = std::operator!=((_Self *)&local_50.m_table,
                            (_Self *)&local_50.m_vals.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar1) {
      return;
    }
    if ((local_50._71_1_ & 1) == 0) {
LAB_00f07793:
      std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator*
                ((_List_const_iterator<amrex::ParmParse::PP_entry> *)local_8);
      poVar3 = amrex::operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      pPVar2 = std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator->
                         ((_List_const_iterator<amrex::ParmParse::PP_entry> *)0xf07715);
      poVar3 = local_8;
      if ((pPVar2->m_queried & 1U) == 0) goto LAB_00f07793;
      std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator->
                ((_List_const_iterator<amrex::ParmParse::PP_entry> *)0xf07732);
      in_stack_ffffffffffffff90 = &local_50;
      PP_entry::print_abi_cxx11_(in_stack_00000138);
      in_stack_ffffffffffffff98 = std::operator<<(poVar3,(string *)in_stack_ffffffffffffff90);
      std::ostream::operator<<(in_stack_ffffffffffffff98,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator++
              ((_List_const_iterator<amrex::ParmParse::PP_entry> *)&local_50.m_table);
  } while( true );
}

Assistant:

void
ParmParse::dumpTable (std::ostream& os, bool prettyPrint)
{
    for ( const_list_iterator li = g_table.begin(), End = g_table.end(); li != End; ++li )
    {
        if(prettyPrint && li->m_queried) {
            os << li->print() << std::endl;
        }
        else
            os << *li << std::endl;
    }
}